

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

void __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest
          (SparseBuffersWithCopyOpsTest *this,Context *context)

{
  uint n;
  long lVar1;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"CommonBug_SparseBuffersWithCopyOps",
             "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU memory transfers are involved."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dde618;
  this->m_page_size = 0;
  this->m_bo_id = 0;
  this->m_bo_read_id = 0;
  this->m_clear_buffer = (uchar *)0x0;
  this->m_result_data_storage_size = 0;
  this->m_n_iterations_to_run = 0x10;
  this->m_n_pages_to_test = 0x10;
  this->m_virtual_bo_size = 0x1f460000;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    this->m_reference_data[lVar1] = (uchar)lVar1;
  }
  return;
}

Assistant:

SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest(deqp::Context& context)
	: TestCase(context, "CommonBug_SparseBuffersWithCopyOps",
			   "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU"
			   " memory transfers are involved.")
	, m_bo_id(0)
	, m_bo_read_id(0)
	, m_clear_buffer(DE_NULL)
	, m_page_size(0)
	, m_result_data_storage_size(0)
	, m_n_iterations_to_run(16)
	, m_n_pages_to_test(16)
	, m_virtual_bo_size(512 /* MB */ * 1024768)
{
	for (unsigned int n = 0; n < sizeof(m_reference_data) / sizeof(m_reference_data[0]); ++n)
	{
		m_reference_data[n] = static_cast<unsigned char>(n);
	}
}